

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_command_line.cpp
# Opt level: O1

void __thiscall
ClCommandLine_MissingOptionName_Test::~ClCommandLine_MissingOptionName_Test
          (ClCommandLine_MissingOptionName_Test *this)

{
  anon_unknown.dwarf_26ec6::ClCommandLine::~ClCommandLine(&this->super_ClCommandLine);
  operator_delete(this,0x28);
  return;
}

Assistant:

TEST_F (ClCommandLine, MissingOptionName) {
    this->add ("progname", "--=a");

    string_stream output;
    string_stream errors;
    EXPECT_FALSE (this->parse_command_line_options (output, errors));
    EXPECT_THAT (errors.str (),
                 testing::HasSubstr (PSTORE_NATIVE_TEXT ("Unknown command line argument")));
    EXPECT_EQ (output.str ().length (), 0U);
}